

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O2

int mdb_env_copyfd2(MDB_env *env,int fd,uint flags)

{
  char *__dest;
  uint uVar1;
  MDB_db *pMVar2;
  pgno_t pVar3;
  pgno_t pVar4;
  pgno_t pVar5;
  MDB_txn *txn_00;
  int iVar6;
  ssize_t sVar7;
  int *piVar8;
  size_t __n;
  ulong uVar9;
  char *pcVar10;
  pthread_mutex_t *mutex;
  MDB_dbx *pMVar11;
  ulong uVar12;
  long lVar13;
  undefined8 txn_01;
  MDB_txn *txn;
  char *local_298;
  pthread_t thr;
  MDB_val local_288;
  pthread_mutex_t local_278;
  pthread_cond_t local_250;
  char *local_220;
  char *local_218;
  MDB_env *local_200;
  MDB_txn *local_1f8;
  int local_1f0 [7];
  undefined4 local_1d4;
  int local_1d0;
  int local_1cc;
  MDB_val key;
  MDB_cursor mc;
  
  if ((flags & 1) != 0) {
    txn = (MDB_txn *)0x0;
    pthread_mutex_init((pthread_mutex_t *)&local_278,(pthread_mutexattr_t *)0x0);
    pthread_cond_init(&local_250,(pthread_condattr_t *)0x0);
    iVar6 = posix_memalign(&local_220,(ulong)env->me_os_psize,0x200000);
    local_218 = local_220;
    if (iVar6 != 0) {
      return iVar6;
    }
    memset(local_220,0,0x200000);
    local_218 = local_218 + 0x100000;
    local_1f0[0] = 0;
    local_1f0[1] = 0;
    local_1f0[2] = 0;
    local_1f0[3] = 0;
    local_1f0[4] = 2;
    local_1f0[5] = 0;
    local_1d4 = 0;
    local_1d0 = 1;
    local_1cc = 0;
    local_200 = env;
    local_1f0[6] = fd;
    pthread_create(&thr,(pthread_attr_t *)0x0,mdb_env_copythr,&local_278);
    iVar6 = mdb_txn_begin(env,(MDB_txn *)0x0,0x20000,&txn);
    pcVar10 = local_220;
    if (iVar6 != 0) {
      return iVar6;
    }
    lVar13 = 0;
    memset(local_220,0,(ulong)(env->me_psize * 2));
    pcVar10[0] = '\0';
    pcVar10[1] = '\0';
    pcVar10[2] = '\0';
    pcVar10[3] = '\0';
    pcVar10[4] = '\0';
    pcVar10[5] = '\0';
    pcVar10[6] = '\0';
    pcVar10[7] = '\0';
    pcVar10[10] = '\b';
    pcVar10[0xb] = '\0';
    pcVar10[0x10] = -0x22;
    pcVar10[0x11] = -0x40;
    pcVar10[0x12] = -0x11;
    pcVar10[0x13] = -0x42;
    pcVar10[0x14] = '\x01';
    pcVar10[0x15] = '\0';
    pcVar10[0x16] = '\0';
    pcVar10[0x17] = '\0';
    *(mdb_size_t *)(pcVar10 + 0x20) = env->me_mapsize;
    uVar1 = env->me_psize;
    *(uint *)(pcVar10 + 0x28) = uVar1;
    pcVar10[0x88] = '\x01';
    pcVar10[0x89] = '\0';
    pcVar10[0x8a] = '\0';
    pcVar10[0x8b] = '\0';
    pcVar10[0x8c] = '\0';
    pcVar10[0x8d] = '\0';
    pcVar10[0x8e] = '\0';
    pcVar10[0x8f] = '\0';
    *(ushort *)(pcVar10 + 0x2c) = (ushort)env->me_flags | 8;
    pcVar10[0x50] = -1;
    pcVar10[0x51] = -1;
    pcVar10[0x52] = -1;
    pcVar10[0x53] = -1;
    pcVar10[0x54] = -1;
    pcVar10[0x55] = -1;
    pcVar10[0x56] = -1;
    pcVar10[0x57] = -1;
    pcVar10[0x80] = -1;
    pcVar10[0x81] = -1;
    pcVar10[0x82] = -1;
    pcVar10[0x83] = -1;
    pcVar10[0x84] = -1;
    pcVar10[0x85] = -1;
    pcVar10[0x86] = -1;
    pcVar10[0x87] = -1;
    *(void **)(pcVar10 + 0x18) = env->me_metas[0]->mm_address;
    local_298 = local_220 + uVar1;
    __dest = local_220 + (ulong)uVar1 + 0x10;
    __dest[-0x10] = '\x01';
    __dest[-0xf] = '\0';
    __dest[-0xe] = '\0';
    __dest[-0xd] = '\0';
    __dest[-0xc] = '\0';
    __dest[-0xb] = '\0';
    __dest[-10] = '\0';
    __dest[-9] = '\0';
    __dest[-6] = '\b';
    __dest[-5] = '\0';
    memcpy(__dest,pcVar10 + 0x10,0x88);
    txn_00 = txn;
    mdb_cursor_init(&mc,txn,0,(MDB_xcursor *)0x0);
    while (iVar6 = mdb_cursor_get(&mc,&key,&local_288,MDB_NEXT), iVar6 == 0) {
      lVar13 = lVar13 + *local_288.mv_data;
    }
    pMVar2 = txn_00->mt_dbs;
    uVar12 = ~(lVar13 + pMVar2->md_branch_pages + pMVar2->md_leaf_pages + pMVar2->md_overflow_pages)
             + txn_00->mt_next_pgno;
    *(ulong *)(local_298 + 0x88) = uVar12;
    pVar3 = pMVar2[1].md_branch_pages;
    pVar4 = pMVar2[1].md_leaf_pages;
    pVar5 = pMVar2[1].md_overflow_pages;
    *(undefined8 *)(local_298 + 0x58) = *(undefined8 *)(pMVar2 + 1);
    *(pgno_t *)(local_298 + 0x60) = pVar3;
    *(pgno_t *)(local_298 + 0x68) = pVar4;
    *(pgno_t *)(local_298 + 0x70) = pVar5;
    *(mdb_size_t *)(local_298 + 0x78) = pMVar2[1].md_entries;
    if (uVar12 < 2) {
      uVar12 = 0xffffffffffffffff;
    }
    else {
      local_298[0x90] = '\x01';
      local_298[0x91] = '\0';
      local_298[0x92] = '\0';
      local_298[0x93] = '\0';
      local_298[0x94] = '\0';
      local_298[0x95] = '\0';
      local_298[0x96] = '\0';
      local_298[0x97] = '\0';
    }
    *(ulong *)(local_298 + 0x80) = uVar12;
    local_1f0[0] = env->me_psize * 2;
    local_1f8 = txn_00;
    pthread_mutex_lock((pthread_mutex_t *)&local_278);
    while (local_1d0 != 0) {
      pthread_cond_wait(&local_250,(pthread_mutex_t *)&local_278);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&local_278);
    iVar6 = mdb_env_cwalk((mdb_copy *)&local_278.__data,&txn_00->mt_dbs[1].md_root,0);
    if ((iVar6 == 0) && (iVar6 = 0, local_1f0[local_1cc] != 0)) {
      iVar6 = mdb_env_cthr_toggle((mdb_copy *)&local_278.__data,1);
    }
    mdb_env_cthr_toggle((mdb_copy *)&local_278.__data,-1);
    pthread_mutex_lock((pthread_mutex_t *)&local_278);
    while (local_1d0 != 0) {
      pthread_cond_wait(&local_250,(pthread_mutex_t *)&local_278);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&local_278);
    pthread_join(thr,(void **)0x0);
    mdb_txn_abort(txn_00);
    pthread_cond_destroy(&local_250);
    pthread_mutex_destroy((pthread_mutex_t *)&local_278);
    free(local_220);
    return iVar6;
  }
  local_278.__align = 0;
  iVar6 = mdb_txn_begin(env,(MDB_txn *)0x0,0x20000,(MDB_txn **)&local_278.__align);
  txn_01 = local_278.__align;
  if (iVar6 != 0) {
    return iVar6;
  }
  if (env->me_txns == (MDB_txninfo *)0x0) {
    mutex = (pthread_mutex_t *)0x0;
  }
  else {
    mdb_txn_end((MDB_txn *)local_278.__align,4);
    mutex = (pthread_mutex_t *)&env->me_txns->mt2;
    iVar6 = pthread_mutex_lock(mutex);
    if ((iVar6 != 0) && (iVar6 = mdb_mutex_failed(env,(mdb_mutexref_t)mutex,iVar6), iVar6 != 0))
    goto LAB_0010e949;
    iVar6 = mdb_txn_renew0((MDB_txn *)txn_01);
    if (iVar6 != 0) {
      pthread_mutex_unlock(mutex);
      goto LAB_0010e949;
    }
  }
  pcVar10 = env->me_map;
  iVar6 = 5;
  uVar9 = (ulong)(env->me_psize * 2);
  for (uVar12 = uVar9; uVar12 != 0; uVar12 = uVar12 - sVar7) {
    sVar7 = write(fd,pcVar10,uVar12);
    if (sVar7 < 0) {
      piVar8 = __errno_location();
      iVar6 = *piVar8;
      goto LAB_0010e932;
    }
    if (sVar7 == 0) goto LAB_0010e932;
    pcVar10 = pcVar10 + sVar7;
  }
  iVar6 = 0;
LAB_0010e932:
  if (mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock(mutex);
  }
  txn_01 = local_278.__align;
  if (iVar6 == 0) {
    pMVar11 = (MDB_dbx *)((ulong)env->me_psize * *(pgno_t *)(local_278.__align + 0x10));
    iVar6 = fstat(env->me_fd,(stat *)&mc);
    if (iVar6 != 0) {
      piVar8 = __errno_location();
      iVar6 = *piVar8;
      if (iVar6 != 0) goto LAB_0010e949;
      mc.mc_dbx = (MDB_dbx *)0x0;
    }
    if (pMVar11 < mc.mc_dbx) {
      mc.mc_dbx = pMVar11;
    }
    iVar6 = 5;
    for (uVar9 = (long)mc.mc_dbx - uVar9; uVar9 != 0; uVar9 = uVar9 - sVar7) {
      __n = 0x40000000;
      if (uVar9 < 0x40000000) {
        __n = uVar9;
      }
      sVar7 = write(fd,pcVar10,__n);
      if (sVar7 < 0) {
        piVar8 = __errno_location();
        iVar6 = *piVar8;
        goto LAB_0010e949;
      }
      if (sVar7 == 0) goto LAB_0010e949;
      pcVar10 = pcVar10 + sVar7;
    }
    iVar6 = 0;
  }
LAB_0010e949:
  mdb_txn_abort((MDB_txn *)txn_01);
  return iVar6;
}

Assistant:

int ESECT
mdb_env_copyfd2(MDB_env *env, HANDLE fd, unsigned int flags)
{
	if (flags & MDB_CP_COMPACT)
		return mdb_env_copyfd1(env, fd);
	else
		return mdb_env_copyfd0(env, fd);
}